

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImVec2 FixLargeWindowsWhenUndocking(ImVec2 *size,ImGuiViewport *ref_viewport)

{
  ImGuiPlatformMonitor *pIVar1;
  ImVec2 *pIVar2;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ImVec2 IVar3;
  
  if (ref_viewport == (ImGuiViewport *)0x0) {
    IVar3 = *size;
  }
  else {
    if ((GImGui->ConfigFlagsCurrFrame & 0x400) == 0) {
      pIVar2 = &ref_viewport->WorkSize;
    }
    else {
      pIVar1 = ImGui::GetViewportPlatformMonitor(ref_viewport);
      pIVar2 = &pIVar1->WorkSize;
    }
    auVar4._8_8_ = 0;
    auVar4._0_4_ = size->x;
    auVar4._4_4_ = size->y;
    auVar5._4_4_ = (float)(int)((*pIVar2).y * (float)0x3f666666);
    auVar5._0_4_ = (float)(int)((*pIVar2).x * (float)0x3f666666);
    auVar5._8_8_ = 0;
    auVar5 = minps(auVar4,auVar5);
    IVar3 = auVar5._0_8_;
  }
  return IVar3;
}

Assistant:

static ImVec2 FixLargeWindowsWhenUndocking(const ImVec2& size, ImGuiViewport* ref_viewport)
{
    if (ref_viewport == NULL)
        return size;

    ImGuiContext& g = *GImGui;
    ImVec2 max_size = ImFloor(ref_viewport->WorkSize * 0.90f);
    if (g.ConfigFlagsCurrFrame & ImGuiConfigFlags_ViewportsEnable)
    {
        const ImGuiPlatformMonitor* monitor = ImGui::GetViewportPlatformMonitor(ref_viewport);
        max_size = ImFloor(monitor->WorkSize * 0.90f);
    }
    return ImMin(size, max_size);
}